

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall host_array_copy_initialize_Test::TestBody(host_array_copy_initialize_Test *this)

{
  bool *passed_00;
  bool bVar1;
  char *message;
  char *in_R9;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  bool passed;
  host_array_copy_initialize_Test *this_local;
  
  passed_00 = (bool *)((long)&gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 7);
  camp::test::array::copy_initialize_host_kernel(passed_00);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,passed_00,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)"passed","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/test/array.cpp",0x1c,
               message);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

CAMP_TEST_BEGIN(array, copy_construct)
{
   camp::array<int, 3> a{1, 2, 10};
   camp::array<int, 3> b{a};
   a[1] = 1;

   return b[0] == 1 &&
          b[1] == 2 &&
          b[2] == 10;
}